

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astLambdaNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t value;
  long lVar5;
  bool bVar6;
  anon_struct_72_9_85cf892b gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  ulong local_a8;
  sysbvm_tuple_t sStack_a0;
  sysbvm_functionDefinition_t *local_98;
  ulong uStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  ulong *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_30 = &local_a8;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_98 = (sysbvm_functionDefinition_t *)0x0;
  uStack_90 = 0;
  local_a8 = 0;
  sStack_a0 = 0;
  value = 0;
  local_68 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 9;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  sVar2 = *arguments;
  uVar1 = *(ulong *)(sVar2 + 0x40);
  bVar6 = (uVar1 & 0xf) != 0;
  if (!bVar6 && uVar1 != 0) {
    if (*(uint *)(uVar1 + 0xc) < 8) {
      value = 0;
    }
    else {
      value = 0;
      uVar4 = 0;
      do {
        if (bVar6 || uVar1 == 0) {
          local_a8 = 0;
          uVar3 = 1;
        }
        else {
          local_a8 = *(ulong *)(uVar1 + 0x10 + uVar4 * 8);
          uVar3 = 1;
          if ((local_a8 & 0xf) == 0 && local_a8 != 0) {
            uVar3 = (ulong)(*(long *)(local_a8 + 0x28) != 0x1f);
          }
        }
        value = value + uVar3;
        uVar4 = uVar4 + 1;
      } while (*(uint *)(uVar1 + 0xc) >> 3 != uVar4);
      if (value + 0x800000000000000 >> 0x3c != 0) {
        sStack_a0 = sysbvm_tuple_uint64_encodeBig(context,value);
        sVar2 = *arguments;
        uVar1 = *(sysbvm_tuple_t *)(sVar2 + 0x40);
        goto LAB_0011d6f6;
      }
    }
  }
  sStack_a0 = value << 4 | 0xb;
LAB_0011d6f6:
  local_98 = (sysbvm_functionDefinition_t *)
             sysbvm_functionDefinition_create
                       (context,*(sysbvm_tuple_t *)(sVar2 + 0x10),*(sysbvm_tuple_t *)(sVar2 + 0x30),
                        *(sysbvm_tuple_t *)(sVar2 + 0x38),sStack_a0,arguments[1],uVar1,
                        *(sysbvm_tuple_t *)(sVar2 + 0x48),*(sysbvm_tuple_t *)(sVar2 + 0x50));
  if ((*(long *)(*arguments + 0x58) == 0) || (*(long *)(*arguments + 0x58) == 0x1f)) {
    sysbvm_functionDefinition_ensureTypeAnalysis(context,&local_98);
    sStack_70 = sysbvm_function_createClosureWithCaptureEnvironment
                          (context,(sysbvm_tuple_t)local_98,arguments[1]);
    sysbvm_environment_enqueuePendingAnalysis(context,arguments[1],sStack_70);
  }
  else {
    sysbvm_functionDefinition_ensureAnalysis(context,&local_98);
    sVar2 = local_98->bytecode;
    lVar5 = 0x48;
    if (sVar2 == 0) {
      sVar2 = local_98->sourceAnalyzedDefinition;
      lVar5 = 0x20;
      if (sVar2 == 0) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/interpreter.c:1466: assertion failure: gcFrame.functionDefinition->sourceAnalyzedDefinition"
                  );
        sVar2 = local_98->sourceAnalyzedDefinition;
      }
    }
    uStack_90 = *(ulong *)(sVar2 + lVar5);
    if ((uStack_90 & 0xf) == 0 && uStack_90 != 0) {
      uVar1 = (ulong)(*(uint *)(uStack_90 + 0xc) >> 3);
    }
    else {
      uVar1 = 0;
    }
    local_88 = sysbvm_sequenceTuple_create(context,local_98->captureVectorType);
    if (uVar1 != 0) {
      uVar4 = 0;
      do {
        if (((uStack_90 & 0xf) == 0 && uStack_90 != 0) &&
           (uVar3 = *(ulong *)(uStack_90 + 0x10 + uVar4 * 8), (uVar3 & 0xf) == 0 && uVar3 != 0)) {
          sStack_80 = *(sysbvm_tuple_t *)(uVar3 + 0x48);
        }
        else {
          sStack_80 = 0;
        }
        local_78 = sysbvm_environment_evaluateSymbolBinding(context,arguments[1],sStack_80);
        if ((local_88 & 0xf) == 0 && local_88 != 0) {
          *(sysbvm_tuple_t *)(local_88 + 0x10 + uVar4 * 8) = local_78;
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    sStack_70 = sysbvm_function_createClosureWithCaptureVector
                          (context,(sysbvm_tuple_t)local_98,local_88);
  }
  if ((*(sysbvm_tuple_t *)(*arguments + 0x28) != 0) &&
     (local_68 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                           (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]),
     local_68 != 0)) {
    sysbvm_environment_setNewSymbolBindingWithValueAtSourcePosition
              (context,arguments[1],local_68,sStack_70,*(sysbvm_tuple_t *)(*arguments + 0x10));
  }
  sysbvm_stackFrame_popRecord(&local_60);
  sysbvm_stackFrame_popRecord(&local_48);
  return sStack_70;
}

Assistant:

static sysbvm_tuple_t sysbvm_astLambdaNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argumentCount;
        sysbvm_functionDefinition_t* functionDefinition;
        
        sysbvm_tuple_t captureList;
        sysbvm_tuple_t captureVector;
        sysbvm_tuple_t captureBinding;
        sysbvm_tuple_t captureValue;
        sysbvm_tuple_t closure;
        sysbvm_tuple_t name;
    } gcFrame = {0};

    sysbvm_astLambdaNode_t **lambdaNode = (sysbvm_astLambdaNode_t**)node;
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*lambdaNode)->super.sourcePosition);

    // Count the actual argument count.
    size_t lambdaArgumentCount = 0;
    size_t argumentNodeCount = sysbvm_array_getSize((*lambdaNode)->arguments);
    for(size_t i = 0; i < argumentNodeCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*lambdaNode)->arguments, i);
        if(!sysbvm_astArgumentNode_isForAll(gcFrame.argumentNode))
            ++lambdaArgumentCount;
    }

    gcFrame.argumentCount = sysbvm_tuple_size_encode(context,  lambdaArgumentCount);
    gcFrame.functionDefinition = (sysbvm_functionDefinition_t*)sysbvm_functionDefinition_create(context,
        (*lambdaNode)->super.sourcePosition, (*lambdaNode)->flags, (*lambdaNode)->callingConventionName,
        gcFrame.argumentCount, *environment,
        (*lambdaNode)->arguments, (*lambdaNode)->resultType, (*lambdaNode)->body
    );
    
    if((*lambdaNode)->hasLazyAnalysis && !sysbvm_tuple_boolean_decode((*lambdaNode)->hasLazyAnalysis))
    {
        sysbvm_functionDefinition_ensureAnalysis(context, &gcFrame.functionDefinition);

        if(gcFrame.functionDefinition->bytecode)
        {
            gcFrame.captureList = ((sysbvm_functionBytecode_t*)gcFrame.functionDefinition->bytecode)->captures;
        }
        else
        {
            SYSBVM_ASSERT(gcFrame.functionDefinition->sourceAnalyzedDefinition);
            gcFrame.captureList = ((sysbvm_functionSourceAnalyzedDefinition_t*)gcFrame.functionDefinition->sourceAnalyzedDefinition)->captures;
        }

        size_t captureVectorSize = sysbvm_array_getSize(gcFrame.captureList);
        gcFrame.captureVector = sysbvm_sequenceTuple_create(context, gcFrame.functionDefinition->captureVectorType);
        for(size_t i = 0; i < captureVectorSize; ++i)
        {
            gcFrame.captureBinding = sysbvm_symbolCaptureBinding_getSourceBinding(sysbvm_array_at(gcFrame.captureList, i));
            gcFrame.captureValue = sysbvm_environment_evaluateSymbolBinding(context, *environment, gcFrame.captureBinding);
            sysbvm_array_atPut(gcFrame.captureVector, i, gcFrame.captureValue);
        }
        gcFrame.closure = sysbvm_function_createClosureWithCaptureVector(context, (sysbvm_tuple_t)gcFrame.functionDefinition, gcFrame.captureVector);
    }
    else
    {
        sysbvm_functionDefinition_ensureTypeAnalysis(context, &gcFrame.functionDefinition);
        gcFrame.closure = sysbvm_function_createClosureWithCaptureEnvironment(context, (sysbvm_tuple_t)gcFrame.functionDefinition, *environment);
        sysbvm_environment_enqueuePendingAnalysis(context, *environment, gcFrame.closure);
    }

    if((*lambdaNode)->name)
    {
        gcFrame.name = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*lambdaNode)->name, *environment);
        if(gcFrame.name)
            sysbvm_environment_setNewSymbolBindingWithValueAtSourcePosition(context, *environment, gcFrame.name, gcFrame.closure, (*lambdaNode)->super.sourcePosition);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.closure;
}